

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPrism>::TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZGeoPrism> *this)

{
  long lVar1;
  
  lVar1 = 0;
  (this->super_TPZGeoEl).fMesh = (TPZGeoMesh *)0x0;
  (this->super_TPZGeoEl).fId = -1;
  (this->super_TPZGeoEl).fMatId = 0;
  (this->super_TPZGeoEl).fReference = (TPZCompEl *)0x0;
  *(undefined4 *)&(this->super_TPZGeoEl).fFatherIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fFatherIndex + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_TPZGeoEl).fIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fIndex + 4) = 0xffffffff;
  (this->super_TPZGeoEl).fNumInterfaces = 0;
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018859a8;
  *(undefined4 *)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes = 0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 4) =
       0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 1) =
       0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 0xc) =
       0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 2) =
       0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 0x14)
       = 0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 3) =
       0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 0x1c)
       = 0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 4) =
       0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 0x24)
       = 0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 5) =
       0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + 0x2c)
       = 0xffffffff;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoPrism_0188d598;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1f8);
  lVar1 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1f8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}